

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeBodies
          (TIntermediate *this,TInfoSink *infoSink,TIntermSequence *globals,
          TIntermSequence *unitGlobals)

{
  TIntermSequence *this_00;
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppTVar7;
  undefined4 extraout_var;
  const_reference ppTVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TInfoSinkBase *pTVar9;
  undefined4 extraout_var_03;
  TString *t;
  __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_70;
  TIntermNode **local_68;
  __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_60;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_58;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_50;
  const_iterator local_48;
  TIntermOperator *local_40;
  TIntermAggregate *unitBody;
  TIntermAggregate *body;
  uint unitChild;
  uint child;
  TIntermSequence *unitGlobals_local;
  TIntermSequence *globals_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  body._4_4_ = 0;
  _unitChild = &unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>;
  unitGlobals_local = globals;
  globals_local = (TIntermSequence *)infoSink;
  infoSink_local = (TInfoSink *)this;
  for (; uVar5 = (ulong)body._4_4_,
      sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        (&unitGlobals_local->
                          super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>),
      this_00 = unitGlobals_local, uVar5 < sVar6 - 1; body._4_4_ = body._4_4_ + 1) {
    for (body._0_4_ = 0; uVar5 = (ulong)(uint)body,
        sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                          (_unitChild), uVar5 < sVar6 - 1; body._0_4_ = (uint)body + 1) {
      ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (&unitGlobals_local->
                            super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>,
                           (ulong)body._4_4_);
      iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[6])();
      unitBody = (TIntermAggregate *)CONCAT44(extraout_var,iVar2);
      ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (_unitChild,(ulong)(uint)body);
      iVar2 = (*(*ppTVar8)->_vptr_TIntermNode[6])();
      local_40 = (TIntermOperator *)CONCAT44(extraout_var_00,iVar2);
      if ((((unitBody != (TIntermAggregate *)0x0) && (local_40 != (TIntermOperator *)0x0)) &&
          (TVar3 = TIntermOperator::getOp(&unitBody->super_TIntermOperator), TVar3 == EOpFunction))
         && (TVar3 = TIntermOperator::getOp(local_40), TVar3 == EOpFunction)) {
        iVar2 = (*(unitBody->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x35])();
        iVar4 = (*(local_40->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x35])();
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_01,iVar2),
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_02,iVar4));
        if (bVar1) {
          error(this,(TInfoSink *)globals_local,
                "Multiple function bodies in multiple compilation units for the same signature in the same stage:"
                ,EShLangCount);
          pTVar9 = TInfoSinkBase::operator<<((TInfoSinkBase *)globals_local,"    ");
          ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (&unitGlobals_local->
                                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                               ,(ulong)body._4_4_);
          iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[6])();
          t = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x1a8))();
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,t);
          TInfoSinkBase::operator<<(pTVar9,"\n");
        }
      }
    }
  }
  local_58._M_current =
       (TIntermNode **)
       std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                 (&unitGlobals_local->
                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>);
  local_50 = __gnu_cxx::
             __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
             ::operator-(&local_58,1);
  __gnu_cxx::
  __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
  ::__normal_iterator<TIntermNode**>
            ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
              *)&local_48,&local_50);
  local_60._M_current =
       (TIntermNode **)
       std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(_unitChild);
  local_70._M_current =
       (TIntermNode **)
       std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(_unitChild);
  local_68 = (TIntermNode **)
             __gnu_cxx::
             __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
             ::operator-(&local_70,1);
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
  insert<__gnu_cxx::__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,void>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)this_00,local_48,local_60
             ,(__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
               )local_68);
  return;
}

Assistant:

void TIntermediate::mergeBodies(TInfoSink& infoSink, TIntermSequence& globals, const TIntermSequence& unitGlobals)
{
    // TODO: link-time performance: Processing in alphabetical order will be faster

    // Error check the global objects, not including the linker objects
    for (unsigned int child = 0; child < globals.size() - 1; ++child) {
        for (unsigned int unitChild = 0; unitChild < unitGlobals.size() - 1; ++unitChild) {
            TIntermAggregate* body = globals[child]->getAsAggregate();
            TIntermAggregate* unitBody = unitGlobals[unitChild]->getAsAggregate();
            if (body && unitBody && body->getOp() == EOpFunction && unitBody->getOp() == EOpFunction && body->getName() == unitBody->getName()) {
                error(infoSink, "Multiple function bodies in multiple compilation units for the same signature in the same stage:");
                infoSink.info << "    " << globals[child]->getAsAggregate()->getName() << "\n";
            }
        }
    }

    // Merge the global objects, just in front of the linker objects
    globals.insert(globals.end() - 1, unitGlobals.begin(), unitGlobals.end() - 1);
}